

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O1

void ggml_compute_forward_pad_reflect_1d(ggml_compute_params *params,ggml_tensor *dst)

{
  int iVar1;
  int iVar2;
  ggml_tensor *pgVar3;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  long lVar12;
  ulong uVar13;
  undefined4 *puVar14;
  char *pcVar15;
  long lVar16;
  undefined4 *puVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined8 uVar21;
  long lVar22;
  long lVar23;
  undefined4 *puVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  
  pgVar3 = dst->src[0];
  if (pgVar3->type == GGML_TYPE_F32) {
    if (dst->type == GGML_TYPE_F32) {
      lVar4 = dst->ne[3];
      if (0 < lVar4) {
        sVar5 = pgVar3->nb[1];
        sVar6 = pgVar3->nb[2];
        sVar7 = pgVar3->nb[3];
        iVar1 = dst->op_params[1];
        iVar2 = dst->op_params[0];
        lVar27 = (long)params->nth;
        lVar22 = (long)params->ith;
        local_c8 = (long)iVar2 * dst->nb[0];
        lVar12 = (~(long)iVar1 + dst->ne[0]) * dst->nb[0];
        uVar28 = (uint)pgVar3->ne[0];
        local_e0 = dst->nb[1] * lVar22;
        lVar26 = dst->nb[1] * lVar27;
        local_d0 = local_c8 + -4 + local_e0;
        local_c8 = local_c8 + local_e0;
        local_d8 = lVar12 + local_e0;
        local_e0 = lVar12 + -4 + local_e0;
        local_f0 = sVar5 * lVar22;
        lVar12 = dst->ne[1];
        lVar8 = dst->ne[2];
        sVar9 = dst->nb[2];
        sVar10 = dst->nb[3];
        lVar20 = 0;
        do {
          if (0 < lVar8) {
            local_88 = local_d8;
            local_90 = local_e0;
            local_98 = local_d0;
            local_e8 = local_f0;
            local_a0 = local_c8;
            lVar19 = 0;
            do {
              if (lVar22 < lVar12) {
                pvVar11 = dst->data;
                lVar25 = (long)pvVar11 + local_a0;
                lVar23 = (long)pgVar3->data + local_e8;
                puVar17 = (undefined4 *)((long)pvVar11 + local_98);
                puVar24 = (undefined4 *)((long)pvVar11 + local_90);
                lVar18 = (long)pvVar11 + local_88;
                lVar16 = lVar22;
                do {
                  if (0 < (int)uVar28) {
                    uVar13 = 0;
                    do {
                      *(undefined4 *)(lVar25 + uVar13 * 4) = *(undefined4 *)(lVar23 + uVar13 * 4);
                      uVar13 = uVar13 + 1;
                    } while ((uVar28 & 0x7fffffff) != uVar13);
                  }
                  if (0 < iVar2) {
                    uVar13 = 1;
                    puVar14 = puVar17;
                    do {
                      *puVar14 = *(undefined4 *)(lVar25 + uVar13 * 4);
                      uVar13 = uVar13 + 1;
                      puVar14 = puVar14 + -1;
                    } while (iVar2 + 1 != uVar13);
                  }
                  if (0 < iVar1) {
                    uVar13 = 1;
                    puVar14 = puVar24;
                    do {
                      *(undefined4 *)(lVar18 + uVar13 * 4) = *puVar14;
                      uVar13 = uVar13 + 1;
                      puVar14 = puVar14 + -1;
                    } while (iVar1 + 1 != uVar13);
                  }
                  lVar16 = lVar16 + lVar27;
                  lVar25 = lVar25 + lVar26;
                  lVar23 = lVar23 + sVar5 * lVar27;
                  puVar17 = (undefined4 *)((long)puVar17 + lVar26);
                  puVar24 = (undefined4 *)((long)puVar24 + lVar26);
                  lVar18 = lVar18 + lVar26;
                } while (lVar16 < lVar12);
              }
              lVar19 = lVar19 + 1;
              local_a0 = local_a0 + sVar9;
              local_e8 = local_e8 + sVar6;
              local_98 = local_98 + sVar9;
              local_90 = local_90 + sVar9;
              local_88 = local_88 + sVar9;
            } while (lVar19 != lVar8);
          }
          lVar20 = lVar20 + 1;
          local_c8 = local_c8 + sVar10;
          local_f0 = local_f0 + sVar7;
          local_d0 = local_d0 + sVar10;
          local_e0 = local_e0 + sVar10;
          local_d8 = local_d8 + sVar10;
        } while (lVar20 != lVar4);
      }
      return;
    }
    pcVar15 = "dst->type == GGML_TYPE_F32";
    uVar21 = 0x1a18;
  }
  else {
    pcVar15 = "src0->type == GGML_TYPE_F32";
    uVar21 = 0x1a17;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,uVar21,"GGML_ASSERT(%s) failed",pcVar15);
}

Assistant:

void ggml_compute_forward_pad_reflect_1d(
        const ggml_compute_params * params,
              ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    GGML_ASSERT(src0->type == GGML_TYPE_F32);
    GGML_ASSERT( dst->type == GGML_TYPE_F32);

    const int ith = params->ith;
    const int nth = params->nth;

    const int32_t * opts = (const int32_t *) dst->op_params;
    const int p0 = opts[0];
    const int p1 = opts[1];

    GGML_TENSOR_UNARY_OP_LOCALS

    for (int64_t i3 = 0; i3 < ne3; i3++) {
        for (int64_t i2 = 0; i2 < ne2; i2++) {
            for (int64_t i1 = ith; i1 < ne1; i1 += nth) {
                float * left  = (float *) ((char *) dst->data + i3*nb3 + i2*nb2 + i1*nb1 +         p0*nb0);
                float * right = (float *) ((char *) dst->data + i3*nb3 + i2*nb2 + i1*nb1 + (ne0-p1-1)*nb0);

                ggml_vec_cpy_f32(ne00, left, (float *) ((char *) src0->data + i3*nb03 + i2*nb02 + i1*nb01));

                for (int i0 = 1; i0 <= p0; i0++) { left[-i0] = left[i0];   }
                for (int i0 = 1; i0 <= p1; i0++) { right[i0] = right[-i0]; }
            }
        }
    }
}